

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

Matrix<float,_4,_4> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::outerProduct<float,4,4>
          (Matrix<float,_4,_4> *__return_storage_ptr__,MatrixCaseUtils *this,Vector<float,_4> *a,
          Vector<float,_4> *b)

{
  float fVar1;
  Vector<float,_4> *pVVar2;
  Matrix<float,_4,_4> *pMVar3;
  float *pfVar4;
  int r;
  long lVar5;
  int row;
  long lVar6;
  long lVar7;
  undefined4 uVar8;
  Matrix<float,_4,_4> retVal;
  
  pMVar3 = __return_storage_ptr__;
  pfVar4 = (float *)&retVal;
  retVal.m_data.m_data[3].m_data[0] = 0.0;
  retVal.m_data.m_data[3].m_data[1] = 0.0;
  retVal.m_data.m_data[3].m_data[2] = 0.0;
  retVal.m_data.m_data[3].m_data[3] = 0.0;
  retVal.m_data.m_data[2].m_data[0] = 0.0;
  retVal.m_data.m_data[2].m_data[1] = 0.0;
  retVal.m_data.m_data[2].m_data[2] = 0.0;
  retVal.m_data.m_data[2].m_data[3] = 0.0;
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  retVal.m_data.m_data[1].m_data[1] = 0.0;
  retVal.m_data.m_data[1].m_data[2] = 0.0;
  retVal.m_data.m_data[1].m_data[3] = 0.0;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  retVal.m_data.m_data[0].m_data[2] = 0.0;
  retVal.m_data.m_data[0].m_data[3] = 0.0;
  lVar5 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      uVar8 = 0x3f800000;
      if (lVar5 != lVar7) {
        uVar8 = 0;
      }
      *(undefined4 *)((long)pfVar4 + lVar7) = uVar8;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x40);
    lVar6 = lVar6 + 1;
    pfVar4 = pfVar4 + 1;
    lVar5 = lVar5 + 0x10;
  } while (lVar6 != 4);
  pfVar4 = (float *)&retVal;
  lVar5 = 0;
  do {
    fVar1 = a->m_data[lVar5];
    lVar6 = 0;
    do {
      pfVar4[lVar6] = *(float *)(this + lVar6) * fVar1;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x10);
    lVar5 = lVar5 + 1;
    pfVar4 = pfVar4 + 1;
  } while (lVar5 != 4);
  (__return_storage_ptr__->m_data).m_data[3].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[3].m_data[1] = 0.0;
  pVVar2 = (__return_storage_ptr__->m_data).m_data;
  pVVar2[3].m_data[2] = 0.0;
  pVVar2[3].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  pVVar2 = (__return_storage_ptr__->m_data).m_data;
  pVVar2[2].m_data[2] = 0.0;
  pVVar2[2].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  pVVar2 = (__return_storage_ptr__->m_data).m_data;
  pVVar2[1].m_data[2] = 0.0;
  pVVar2[1].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[3] = 0.0;
  lVar5 = 0;
  lVar6 = 0;
  pfVar4 = (float *)__return_storage_ptr__;
  do {
    lVar7 = 0;
    do {
      uVar8 = 0x3f800000;
      if (lVar5 != lVar7) {
        uVar8 = 0;
      }
      *(undefined4 *)((long)pfVar4 + lVar7) = uVar8;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x40);
    lVar6 = lVar6 + 1;
    pfVar4 = pfVar4 + 1;
    lVar5 = lVar5 + 0x10;
  } while (lVar6 != 4);
  pfVar4 = (float *)&retVal;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      *(float *)((long)((Vector<tcu::Vector<float,_4>,_4> *)
                       ((Vector<float,_4> *)__return_storage_ptr__)->m_data)->m_data[0].m_data +
                lVar6) = pfVar4[lVar6];
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x10);
    lVar5 = lVar5 + 1;
    __return_storage_ptr__ = (Matrix<float,_4,_4> *)((long)__return_storage_ptr__ + 0x10);
    pfVar4 = pfVar4 + 1;
  } while (lVar5 != 4);
  return pMVar3;
}

Assistant:

tcu::Matrix<T, Cols, Rows> outerProduct (const tcu::Vector<T, Cols>& a, const tcu::Vector<T, Rows>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a[c] * b[r];

	return transpose(retVal); // to gl-form (column-major)
}